

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

void __thiscall
QXmlStreamReaderPrivate::QXmlStreamReaderPrivate(QXmlStreamReaderPrivate *this,QXmlStreamReader *q)

{
  QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *this_00;
  Value *pVVar1;
  int *piVar2;
  EVP_PKEY_CTX *ctx;
  long in_FS_OFFSET;
  QLatin1StringView name;
  QLatin1StringView name_00;
  QLatin1StringView name_01;
  QLatin1StringView name_02;
  QLatin1StringView name_03;
  QLatin1StringView value;
  QLatin1StringView value_00;
  QLatin1StringView value_01;
  QLatin1StringView value_02;
  QLatin1StringView value_03;
  Entity e;
  QStringView local_88;
  undefined1 local_78 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamPrivateTagStack::QXmlStreamPrivateTagStack(&this->super_QXmlStreamPrivateTagStack);
  this->q_ptr = q;
  (this->readBuffer).d.d = (Data *)0x0;
  (this->readBuffer).d.ptr = (char16_t *)0x0;
  (this->readBuffer).d.size = 0;
  (this->putStack).data = (uint *)0x0;
  (this->rawReadBuffer).d.d = (Data *)0x0;
  (this->rawReadBuffer).d.ptr = (char *)0x0;
  (this->rawReadBuffer).d.size = 0;
  (this->dataBuffer).d.d = (Data *)0x0;
  (this->dataBuffer).d.ptr = (char *)0x0;
  (this->dataBuffer).d.size = 0;
  (this->putStack).tos = -1;
  this_00 = &this->entityHash;
  (this->putStack).cap = 0;
  (this->entityHash).d = (Data *)0x0;
  (this->parameterEntityHash).d = (Data *)0x0;
  (this->entityReferenceStack).data = (QEntityReference *)0x0;
  (this->entityReferenceStack).tos = -1;
  (this->entityReferenceStack).cap = 0;
  this->entityExpansionLimit = 0x1000;
  this->entityLength = 0;
  (this->decoder).super_QStringConverter.iface = (Interface *)0x0;
  (this->decoder).super_QStringConverter.state.flags =
       (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)0x0;
  (this->decoder).super_QStringConverter.state.internalState = 0;
  (this->decoder).super_QStringConverter.state.remainingChars = 0;
  (this->decoder).super_QStringConverter.state.invalidChars = 0;
  (this->decoder).super_QStringConverter.state.field_4.d[0] = (void *)0x0;
  (this->decoder).super_QStringConverter.state.field_4.d[1] = (void *)0x0;
  (this->decoder).super_QStringConverter.state.clearFn = (ClearDataFn)0x0;
  this->currentContext = Prolog;
  this->foundDTD = false;
  (this->attributes).super_QList<QXmlStreamAttribute>.d.size = 0;
  (this->attributes).super_QList<QXmlStreamAttribute>.d.d = (Data *)0x0;
  (this->attributes).super_QList<QXmlStreamAttribute>.d.ptr = (QXmlStreamAttribute *)0x0;
  (this->lastAttributeValue).m_string = (QString *)0x0;
  (this->lastAttributeValue).m_pos = 0;
  (this->lastAttributeValue).m_size = 0;
  (this->dtdAttributes).data = (DtdAttribute *)0x0;
  (this->errorString).d.d = (Data *)0x0;
  (this->errorString).d.ptr = (char16_t *)0x0;
  (this->errorString).d.size = 0;
  (this->unresolvedEntity).d.d = (Data *)0x0;
  (this->unresolvedEntity).d.ptr = (char16_t *)0x0;
  (this->unresolvedEntity).d.size = 0;
  (this->dtdAttributes).tos = -1;
  (this->dtdAttributes).cap = 0;
  (this->notationDeclarations).data = (NotationDeclaration *)0x0;
  (this->notationDeclarations).tos = -1;
  (this->notationDeclarations).cap = 0;
  (this->publicNotationDeclarations).d.d = (Data *)0x0;
  (this->publicNotationDeclarations).d.ptr = (QXmlStreamNotationDeclaration *)0x0;
  (this->publicNotationDeclarations).d.size = 0;
  (this->publicNamespaceDeclarations).d.d = (Data *)0x0;
  (this->publicNamespaceDeclarations).d.ptr = (QXmlStreamNamespaceDeclaration *)0x0;
  (this->publicNamespaceDeclarations).d.size = 0;
  (this->entityDeclarations).data = (EntityDeclaration *)0x0;
  (this->entityDeclarations).tos = -1;
  ctx = (EVP_PKEY_CTX *)0x0;
  memset(&(this->entityDeclarations).cap,0,0x140);
  (this->textBuffer).d.d = (Data *)0x0;
  (this->textBuffer).d.ptr = (char16_t *)0x0;
  (this->textBuffer).d.size = 0;
  (this->attributeStack).data = (Attribute *)0x0;
  (this->attributeStack).tos = -1;
  (this->attributeStack).cap = 0;
  (this->entityParser)._M_t.
  super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>.
  super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl =
       (QXmlStreamReaderPrivate *)0x0;
  this->device = (QIODevice *)0x0;
  this->deleteDevice = false;
  this->sym_stack = (Value *)0x0;
  this->state_stack = (int *)0x0;
  this->stack_size = 0x80;
  pVVar1 = (Value *)malloc(0xc00);
  this->sym_stack = pVVar1;
  if (pVVar1 != (Value *)0x0) {
    piVar2 = (int *)malloc(0x200);
    this->state_stack = piVar2;
    if (piVar2 != (int *)0x0) {
      this->entityResolver = (QXmlStreamEntityResolver *)0x0;
      init(this,ctx);
      local_78._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      name.m_data = "lt";
      name.m_size = 2;
      value.m_data = "<";
      value.m_size = 1;
      Entity::createLiteral((Entity *)local_78,name,value);
      local_88.m_size = local_78._16_8_;
      local_88.m_data = (storage_type_conflict *)local_78._8_8_;
      QHash<QStringView,QXmlStreamReaderPrivate::Entity>::
      emplace<QXmlStreamReaderPrivate::Entity_const&>
                ((QHash<QStringView,QXmlStreamReaderPrivate::Entity> *)this_00,&local_88,
                 (Entity *)local_78);
      if ((QArrayData *)local_78._24_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._24_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
      local_78._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      name_00.m_data = "gt";
      name_00.m_size = 2;
      value_00.m_data = ">";
      value_00.m_size = 1;
      Entity::createLiteral((Entity *)local_78,name_00,value_00);
      local_88.m_size = local_78._16_8_;
      local_88.m_data = (storage_type_conflict *)local_78._8_8_;
      QHash<QStringView,QXmlStreamReaderPrivate::Entity>::
      emplace<QXmlStreamReaderPrivate::Entity_const&>
                ((QHash<QStringView,QXmlStreamReaderPrivate::Entity> *)this_00,&local_88,
                 (Entity *)local_78);
      if ((QArrayData *)local_78._24_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._24_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
      local_78._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      name_01.m_data = "amp";
      name_01.m_size = 3;
      value_01.m_data = "&";
      value_01.m_size = 1;
      Entity::createLiteral((Entity *)local_78,name_01,value_01);
      local_88.m_size = local_78._16_8_;
      local_88.m_data = (storage_type_conflict *)local_78._8_8_;
      QHash<QStringView,QXmlStreamReaderPrivate::Entity>::
      emplace<QXmlStreamReaderPrivate::Entity_const&>
                ((QHash<QStringView,QXmlStreamReaderPrivate::Entity> *)this_00,&local_88,
                 (Entity *)local_78);
      if ((QArrayData *)local_78._24_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._24_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
      local_78._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      name_02.m_data = "apos";
      name_02.m_size = 4;
      value_02.m_data = "\'";
      value_02.m_size = 1;
      Entity::createLiteral((Entity *)local_78,name_02,value_02);
      local_88.m_size = local_78._16_8_;
      local_88.m_data = (storage_type_conflict *)local_78._8_8_;
      QHash<QStringView,QXmlStreamReaderPrivate::Entity>::
      emplace<QXmlStreamReaderPrivate::Entity_const&>
                ((QHash<QStringView,QXmlStreamReaderPrivate::Entity> *)this_00,&local_88,
                 (Entity *)local_78);
      if ((QArrayData *)local_78._24_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._24_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
      local_78._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      name_03.m_data = "quot";
      name_03.m_size = 4;
      value_03.m_data = "\"";
      value_03.m_size = 1;
      Entity::createLiteral((Entity *)local_78,name_03,value_03);
      local_88.m_size = local_78._16_8_;
      local_88.m_data = (storage_type_conflict *)local_78._8_8_;
      QHash<QStringView,QXmlStreamReaderPrivate::Entity>::
      emplace<QXmlStreamReaderPrivate::Entity_const&>
                ((QHash<QStringView,QXmlStreamReaderPrivate::Entity> *)this_00,&local_88,
                 (Entity *)local_78);
      if ((QArrayData *)local_78._24_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._24_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      goto LAB_003a0de6;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    qBadAlloc();
  }
LAB_003a0de6:
  __stack_chk_fail();
}

Assistant:

QXmlStreamReaderPrivate::QXmlStreamReaderPrivate(QXmlStreamReader *q)
    :q_ptr(q)
{
    device = nullptr;
    deleteDevice = false;
    stack_size = 64;
    sym_stack = nullptr;
    state_stack = nullptr;
    reallocateStack();
    entityResolver = nullptr;
    init();
#define ADD_PREDEFINED(n, v) \
    do { \
        Entity e = Entity::createLiteral(n##_L1, v##_L1); \
        entityHash.insert(qToStringViewIgnoringNull(e.name), std::move(e)); \
    } while (false)
    ADD_PREDEFINED("lt", "<");
    ADD_PREDEFINED("gt", ">");
    ADD_PREDEFINED("amp", "&");
    ADD_PREDEFINED("apos", "'");
    ADD_PREDEFINED("quot", "\"");
#undef ADD_PREDEFINED
}